

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O2

bool __thiscall r_exec::HLPOverlay::scan_variable(HLPOverlay *this,uint16_t index)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  undefined8 in_RAX;
  byte unaff_BPL;
  ulong uVar5;
  bool bVar6;
  Atom a;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar3 = r_code::Atom::asIndex();
  bVar1 = r_code::Atom::getAtomCount();
  uVar5 = (ulong)bVar1;
  do {
    uVar3 = uVar3 + 1;
    bVar6 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar6) {
      unaff_BPL = 0;
      break;
    }
    uStack_38 = CONCAT44(*(undefined4 *)((this->super_Overlay).code + (ulong)uVar3 * 4),
                         (undefined4)uStack_38);
    cVar2 = r_code::Atom::getDescriptor();
    bVar6 = true;
    if ((cVar2 == -0x73) && (uVar4 = r_code::Atom::asIndex(), uVar3 == uVar4)) {
      bVar1 = r_code::Atom::asAssignmentIndex();
      unaff_BPL = scan_location(this,(ushort)bVar1);
      bVar6 = false;
    }
    r_code::Atom::~Atom((Atom *)((long)&uStack_38 + 4));
  } while (bVar6);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool HLPOverlay::scan_variable(uint16_t index)   // check if the variable can be bound.
{
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        switch (a.getDescriptor()) {
        case Atom::ASSIGN_PTR:
            if (a.asIndex() == index) {
                return scan_location(a.asAssignmentIndex());
            }

            break;
        }
    }

    return false;
}